

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

int Nf_StoCellIsDominated(Mio_Cell2_t *pCell,int *pFans,int *pProf)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  
  if ((float)*pProf <= pCell->AreaF + 0.001) {
    uVar3 = 0;
    do {
      if (*(uint *)&pCell->field_0x10 >> 0x1c == uVar3) {
        return 1;
      }
      puVar1 = (uint *)(pFans + uVar3);
      if ((int)*puVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      lVar2 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (pProf[lVar2] <= pCell->iDelays[*puVar1 >> 1]);
  }
  return 0;
}

Assistant:

int Nf_StoCellIsDominated( Mio_Cell2_t * pCell, int * pFans, int * pProf )
{
    int k;
    if ( pCell->AreaF + NF_EPSILON < Abc_Int2Float(pProf[0]) )
        return 0;
    for ( k = 0; k < (int)pCell->nFanins; k++ )
        if ( pCell->iDelays[Abc_Lit2Var(pFans[k])] < pProf[k+1] )
            return 0;
    return 1; // pCell is dominated
}